

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionElimination.cc
# Opt level: O3

bool flow::transform::eliminateUnusedInstr(IRHandler *handler)

{
  _List_node_base *p_Var1;
  _List_node_base *__filename;
  _List_node_base *p_Var2;
  long lVar3;
  long lVar4;
  _List_node_base *p_Var5;
  _func_int **local_38;
  
  p_Var1 = (handler->blocks_).
           super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  do {
    if (p_Var1 == (_List_node_base *)&handler->blocks_) {
      return false;
    }
    __filename = p_Var1[1]._M_next;
    p_Var2 = *(_List_node_base **)((long)(__filename + 5) + 8);
    for (p_Var5 = __filename[5]._M_next; p_Var5 != p_Var2;
        p_Var5 = (_List_node_base *)&p_Var5->_M_prev) {
      lVar3 = (long)p_Var5->_M_next;
      if ((((lVar3 != 0) &&
           (lVar4 = __dynamic_cast(lVar3,&Instr::typeinfo,&CallInstr::typeinfo,0), lVar4 != 0)) &&
          ((*(byte *)(*(long *)(**(long **)(lVar4 + 0x50) + 0x48) + 0x90) & 4) != 0)) &&
         ((*(int *)(lVar3 + 8) != 0 && (*(long *)(lVar3 + 0x30) == *(long *)(lVar3 + 0x38))))) {
        BasicBlock::remove((BasicBlock *)&stack0xffffffffffffffc8,(char *)__filename);
        if (local_38 == (_func_int **)0x0) {
          return true;
        }
        (**(code **)(*local_38 + 8))();
        return true;
      }
    }
    p_Var1 = p_Var1->_M_next;
  } while( true );
}

Assistant:

bool eliminateUnusedInstr(IRHandler* handler) {
  for (BasicBlock* bb : handler->basicBlocks()) {
    for (Instr* instr : bb->instructions()) {
      if (auto f = dynamic_cast<CallInstr*>(instr)) {
        if (f->callee()->getNative().isReadOnly()) {
          if (instr->type() != LiteralType::Void && !instr->isUsed()) {
            bb->remove(instr);
            return true;
          }
        }
      }
    }
  }
  return false;
}